

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O3

void test_parallel_for_each(void)

{
  task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *ptVar1;
  sem_t *psVar2;
  uint64_t uid;
  bool bVar3;
  ulong uVar4;
  undefined4 uVar5;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  uint uVar7;
  undefined8 *puVar8;
  long *plVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  timing_registry *this_00;
  uint uVar11;
  size_type *psVar12;
  element_type *peVar13;
  sem_t **ppsVar14;
  __pthread_internal_list *p_Var15;
  uint uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar17;
  uint __val;
  ulong uVar18;
  sem_t *psVar19;
  undefined4 uVar20;
  uint uVar21;
  long lVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  test __t;
  uint __uval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string __str_3;
  string __str_2;
  atomic<unsigned_long> count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  test local_3b5;
  uint local_3b4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  sem_t **local_3a8;
  long local_3a0;
  sem_t *local_398;
  long lStack_390;
  undefined1 local_388 [32];
  element_type *local_368;
  long local_360;
  undefined1 local_358 [32];
  undefined1 local_338 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_320;
  scheduler<concurrent_queue> *local_310 [2];
  undefined1 local_300 [16];
  unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_> *local_2f0;
  long local_2e8;
  unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_> local_2e0 [2];
  undefined1 local_2d0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  task_handle *local_270 [2];
  task_handle local_260;
  string local_250 [16];
  undefined1 local_240 [16];
  task_handle **local_230 [2];
  task_handle *local_220 [2];
  task_handle *local_210 [2];
  task_handle local_200;
  task_handle *local_1f0 [2];
  task_handle local_1e0;
  string local_1d0 [16];
  undefined1 local_1c0 [16];
  task_handle *local_1b0 [2];
  task_handle local_1a0;
  task_handle *local_190 [2];
  task_handle local_180;
  undefined1 local_170 [32];
  string local_150 [16];
  __pthread_internal_list local_140;
  task_handle *local_130 [2];
  task_handle local_120;
  task_handle *local_110 [2];
  task_handle local_100;
  undefined1 local_f0 [48];
  __pthread_internal_list local_c0;
  task_handle *local_b0 [2];
  task_handle local_a0;
  task_handle *local_90 [2];
  task_handle local_80;
  string local_70 [16];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  test::test(&local_3b5,"test_parallel_for_each");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Lorem ipsum dolor","");
  local_270[0] = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270," sit amet, consectetur","");
  local_250._0_8_ = local_240;
  std::__cxx11::string::_M_construct<char_const*>(local_250," adipiscing elit.","");
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Nullam nulla sapien,","");
  local_210[0] = &local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210," mattis a egestas id,","");
  local_1f0[0] = &local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0," lobortis ut mauris.","");
  local_1d0._0_8_ = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>(local_1d0,"Proin consectetur finibus diam,","");
  local_1b0[0] = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0," eu maximus velit interdum sed.","");
  local_190[0] = &local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"Quisque massa nibh, molestie vitae","");
  local_170._0_8_ = local_170 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170," volutpat sed, lacinia non odio.","");
  local_150._0_8_ = &local_140;
  std::__cxx11::string::_M_construct<char_const*>
            (local_150,"Aenean dui enim, porttitor quis velit quis,","");
  local_130[0] = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130," lacinia viverra ex.","");
  local_110[0] = &local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"Vivamus et libero sit amet orci consequat consectetur.","");
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Duis eu porttitor nunc,","");
  local_f0._32_8_ = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_f0 + 0x20)," nec scelerisque mi.Cras efficitur lobortis elit, id","");
  local_b0[0] = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0," scelerisque diam interdum ut.","");
  local_90[0] = &local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"Quisque blandit sodales venenatis.","");
  local_70._0_8_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            (local_70,"Ut at purus congue dolor cursus posuere.","");
  plVar9 = local_40;
  local_50[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Aliquam ac volutpat turpis, ac placerat nisl.","");
  __l._M_len = 0x13;
  __l._M_array = &local_290;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a8,__l,(allocator_type *)local_388);
  lVar22 = -0x260;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar22 = lVar22 + 0x20;
  } while (lVar22 != 0);
  local_2d0._32_8_ = (__pthread_internal_list *)0x0;
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,"FibonacciParallelForEach","");
  uVar5 = oqpi::
          helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
          ::scheduler_._32_4_;
  uVar17 = (ulong)((long)local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar16 = (uint)uVar17;
  uVar18 = (ulong)(uint)oqpi::
                        helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                        ::scheduler_._32_4_;
  if ((int)uVar16 <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    uVar18 = uVar17 & 0xffffffff;
  }
  __val = (uint)uVar18;
  if ((int)uVar16 <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    uVar21 = 0;
    uVar20 = 1;
  }
  else {
    uVar4 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
    uVar21 = (uint)((long)uVar4 % (long)(int)__val);
    uVar20 = (undefined4)((long)uVar4 / (long)(int)__val);
  }
  if ((int)uVar16 < 1) goto LAB_0016c5cc;
  local_3a8 = &local_398;
  local_3b4 = uVar21;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,local_2f0,
             (long)&(local_2f0->_M_t).
                    super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_oqpi::worker_base_*,_std::default_delete<oqpi::worker_base>_>
                    .super__Head_base<0UL,_oqpi::worker_base_*,_false>._M_head_impl + local_2e8);
  std::__cxx11::string::append((char *)&local_3a8);
  uVar21 = 1;
  if (9 < uVar16) {
    uVar7 = 4;
    do {
      uVar21 = uVar7;
      uVar11 = (uint)uVar17;
      if (uVar11 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_0016be69;
      }
      if (uVar11 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_0016be69;
      }
      if (uVar11 < 10000) goto LAB_0016be69;
      uVar17 = (uVar17 & 0xffffffff) / 10000;
      uVar7 = uVar21 + 4;
    } while (99999 < uVar11);
    uVar21 = uVar21 + 1;
  }
LAB_0016be69:
  local_368 = (element_type *)local_358;
  std::__cxx11::string::_M_construct((ulong)&local_368,(char)uVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_368,uVar21,uVar16);
  psVar19 = (sem_t *)0xf;
  if (local_3a8 != &local_398) {
    psVar19 = local_398;
  }
  if (psVar19 < (sem_t *)(local_360 + local_3a0)) {
    psVar19 = (sem_t *)0xf;
    if (local_368 != (element_type *)local_358) {
      psVar19 = (sem_t *)local_358._0_8_;
    }
    if (psVar19 < (sem_t *)(local_360 + local_3a0)) goto LAB_0016bedd;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_3a8);
  }
  else {
LAB_0016bedd:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_368);
  }
  local_388._0_8_ = local_388 + 0x10;
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_388._16_8_ = *plVar9;
    local_388._24_8_ = puVar8[3];
  }
  else {
    local_388._16_8_ = *plVar9;
    local_388._0_8_ = (long *)*puVar8;
  }
  local_388._8_8_ = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_388);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_290.field_2._M_allocated_capacity = *psVar12;
    local_290.field_2._8_8_ = plVar9[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar12;
    local_290._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_290._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (local_368 != (element_type *)local_358) {
    operator_delete(local_368,local_358._0_8_ + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,(long)local_398 + 1);
  }
  local_310[0] = (scheduler<concurrent_queue> *)CONCAT71(local_310[0]._1_7_,2);
  local_388._0_4_ = __val;
  local_3a8 = (sem_t **)((ulong)local_3a8 & 0xffffffff00000000);
  std::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>,oqpi::scheduler<concurrent_queue>&,std::__cxx11::string_const&,oqpi::task_priority&,int&,int&>
            ((__shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_328,
             (allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)&local_368,
             (scheduler<concurrent_queue> *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_,&local_290,(task_priority *)local_310,(int *)local_388,(int *)&local_3a8);
  local_3b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_3b0->_M_use_count = 1;
  local_3b0->_M_weak_count = 1;
  local_3b0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f8e10;
  p_Var15 = (__pthread_internal_list *)0x0;
  *(undefined4 *)&local_3b0[1]._vptr__Sp_counted_base = 0;
  *(uint *)((long)&local_3b0[1]._vptr__Sp_counted_base + 4) = uVar16;
  local_3b0[1]._M_use_count = uVar16;
  local_3b0[1]._M_weak_count = __val;
  *(undefined4 *)&local_3b0[2]._vptr__Sp_counted_base = uVar20;
  *(uint *)((long)&local_3b0[2]._vptr__Sp_counted_base + 4) = local_3b4;
  local_3b0[2]._M_use_count = 0;
  if (0 < (int)uVar5) {
    local_2d0._16_8_ = local_3b0 + 1;
    do {
      local_3b4 = (uint)p_Var15 + 1;
      uVar16 = 1;
      if (8 < (uint)p_Var15) {
        uVar21 = local_3b4;
        uVar7 = 4;
        do {
          uVar16 = uVar7;
          if (uVar21 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_0016c0f5;
          }
          if (uVar21 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_0016c0f5;
          }
          if (uVar21 < 10000) goto LAB_0016c0f5;
          bVar3 = 99999 < uVar21;
          uVar21 = uVar21 / 10000;
          uVar7 = uVar16 + 4;
        } while (bVar3);
        uVar16 = uVar16 + 1;
      }
LAB_0016c0f5:
      local_310[0] = (scheduler<concurrent_queue> *)local_300;
      local_2d0._24_8_ = p_Var15;
      std::__cxx11::string::_M_construct((ulong)local_310,(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_310[0],uVar16,local_3b4);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_310,0,(char *)0x0,0x1c889b);
      peVar13 = (element_type *)(plVar9 + 2);
      if ((element_type *)*plVar9 == peVar13) {
        local_358._0_8_ = (peVar13->super_task_base)._vptr_task_base;
        local_358._8_8_ = plVar9[3];
        local_368 = (element_type *)local_358;
      }
      else {
        local_358._0_8_ = (peVar13->super_task_base)._vptr_task_base;
        local_368 = (element_type *)*plVar9;
      }
      local_360 = plVar9[1];
      *plVar9 = (long)peVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_368);
      local_3a8 = &local_398;
      ppsVar14 = (sem_t **)(plVar9 + 2);
      if ((sem_t **)*plVar9 == ppsVar14) {
        local_398 = *ppsVar14;
        lStack_390 = plVar9[3];
      }
      else {
        local_398 = *ppsVar14;
        local_3a8 = (sem_t **)*plVar9;
      }
      local_3a0 = plVar9[1];
      *plVar9 = (long)ppsVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar16 = 1;
      if (9 < __val) {
        uVar17 = uVar18;
        uVar21 = 4;
        do {
          uVar16 = uVar21;
          uVar7 = (uint)uVar17;
          if (uVar7 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_0016c233;
          }
          if (uVar7 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_0016c233;
          }
          if (uVar7 < 10000) goto LAB_0016c233;
          uVar17 = uVar17 / 10000;
          uVar21 = uVar16 + 4;
        } while (99999 < uVar7);
        uVar16 = uVar16 + 1;
      }
LAB_0016c233:
      local_358._16_8_ = local_338;
      std::__cxx11::string::_M_construct((ulong)(local_358 + 0x10),(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_358._16_8_,uVar16,__val);
      psVar19 = (sem_t *)0xf;
      if (local_3a8 != &local_398) {
        psVar19 = local_398;
      }
      psVar2 = (sem_t *)((long)(_func_int ***)local_358._24_8_ + local_3a0);
      if (psVar19 < psVar2) {
        psVar19 = (sem_t *)0xf;
        if ((element_type *)local_358._16_8_ != (element_type *)local_338) {
          psVar19 = (sem_t *)local_338._0_8_;
        }
        if (psVar19 < psVar2) goto LAB_0016c2be;
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)(local_358 + 0x10),0,(char *)0x0,(ulong)local_3a8);
      }
      else {
LAB_0016c2be:
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_3a8,local_358._16_8_);
      }
      local_388._0_8_ = local_388 + 0x10;
      ptVar1 = (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                *)(plVar9 + 2);
      if ((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)*plVar9 == ptVar1) {
        local_388._16_8_ = (ptVar1->super_task_group_base).super_task_base._vptr_task_base;
        local_388._24_8_ = plVar9[3];
      }
      else {
        local_388._16_8_ = (ptVar1->super_task_group_base).super_task_base._vptr_task_base;
        local_388._0_8_ =
             (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *)*plVar9;
      }
      local_388._8_8_ = plVar9[1];
      *plVar9 = (long)ptVar1;
      plVar9[1] = 0;
      *(undefined1 *)&(ptVar1->super_task_group_base).super_task_base._vptr_task_base = 0;
      if ((element_type *)local_358._16_8_ != (element_type *)local_338) {
        operator_delete((void *)local_358._16_8_,local_338._0_8_ + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,(long)local_398 + 1);
      }
      if (local_368 != (element_type *)local_358) {
        operator_delete(local_368,local_358._0_8_ + 1);
      }
      if (local_310[0] != (scheduler<concurrent_queue> *)local_300) {
        operator_delete(local_310[0],
                        (ulong)((long)&(((__uniq_ptr_data<oqpi::worker_base,_std::default_delete<oqpi::worker_base>,_true,_true>
                                          *)local_300._0_8_)->
                                       super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                                       )._M_t.
                                       super__Tuple_impl<0UL,_oqpi::worker_base_*,_std::default_delete<oqpi::worker_base>_>
                                       .super__Head_base<0UL,_oqpi::worker_base_*,_false>.
                                       _M_head_impl + 1));
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
      }
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      p_Var10->_M_use_count = 1;
      p_Var10->_M_weak_count = 1;
      p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f8498;
      p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_001f8180;
      LOCK();
      UNLOCK();
      uVar5 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar22 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var10[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar22;
      p_Var10[1]._M_weak_count = uVar5;
      p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var10[2]._M_use_count = 0;
      p_Var10[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var10[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var10[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f84e8;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var10[3]._M_use_count = p_Var10 + 1;
      this_00 = timing_registry::get();
      uid._0_4_ = p_Var10[1]._M_use_count;
      uid._4_4_ = p_Var10[1]._M_weak_count;
      timing_registry::registerTask(this_00,uid,(string *)local_388);
      p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f84e8;
      *(int *)&p_Var10[4]._vptr__Sp_counted_base = (int)local_2d0._24_8_;
      *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        **)&p_Var10[4]._M_use_count = &local_2a8;
      p_Var10[5]._vptr__Sp_counted_base = (_func_int **)(local_2d0 + 0x20);
      p_Var10[5]._M_use_count = local_2d0._16_4_;
      p_Var10[5]._M_weak_count = local_2d0._20_4_;
      p_Var10[6]._vptr__Sp_counted_base = (_func_int **)local_3b0;
      local_2d0._0_8_ = p_Var10 + 1;
      local_2d0._8_8_ = p_Var10;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                 *)local_328._M_pi,(task_handle *)local_2d0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
      }
      if ((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)local_388._0_8_ !=
          (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
      }
      p_Var15 = (__pthread_internal_list *)(ulong)local_3b4;
    } while (local_3b4 != __val);
  }
  this._M_pi = _Stack_320._M_pi;
  _Var6._M_pi = local_328._M_pi;
  local_328._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
  if (_Stack_320._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_320._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
       *)_Var6._M_pi !=
      (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
       *)0x0) {
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
      }
    }
    local_388._0_8_ = _Var6._M_pi;
    local_388._8_8_ = this._M_pi;
    oqpi::scheduler<concurrent_queue>::add
              ((scheduler<concurrent_queue> *)&local_290,
               (task_handle *)
               oqpi::
               helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
               ::scheduler_);
    oqpi::task_handle::validate((task_handle *)&local_290);
    (**(code **)(*(size_type *)local_290._M_dataplus._M_p + 0x28))();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
    }
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
LAB_0016c5cc:
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,
                    (ulong)((long)local_2e0[0]._M_t.
                                  super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_oqpi::worker_base_*,_std::default_delete<oqpi::worker_base>_>
                                  .super__Head_base<0UL,_oqpi::worker_base_*,_false>._M_head_impl +
                           1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  test::~test(&local_3b5);
  return;
}

Assistant:

void test_parallel_for_each()
{
    TEST_FUNC;

    std::vector<std::string> vec
    {
        "Lorem ipsum dolor",
        " sit amet, consectetur",
        " adipiscing elit.",
        "Nullam nulla sapien,",
        " mattis a egestas id,",
        " lobortis ut mauris.",
        "Proin consectetur finibus diam,",
        " eu maximus velit interdum sed.",
        "Quisque massa nibh, molestie vitae",
        " volutpat sed, lacinia non odio.",
        "Aenean dui enim, porttitor quis velit quis,",
        " lacinia viverra ex.",
        "Vivamus et libero sit amet orci consequat consectetur.",
        "Duis eu porttitor nunc,",
        " nec scelerisque mi.Cras efficitur lobortis elit, id",
        " scelerisque diam interdum ut.",
        "Quisque blandit sodales venenatis.",
        "Ut at purus congue dolor cursus posuere.",
        "Aliquam ac volutpat turpis, ac placerat nisl."
    };
    const auto vecSize = int32_t(vec.size());
    std::atomic<uint64_t> count = 0;

    oqpi_tk::parallel_for_each("FibonacciParallelForEach", vec,
        [&count](const std::string &s)
    {
        uint64_t total = 0;
        for (auto c : s)
        {
            total += uint64_t(c) * 100;
        }
        count += fibonacci(total);
    });
}